

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRecognizer.cpp
# Opt level: O2

Encodings xercesc_4_0::XMLRecognizer::basicEncodingProbe(XMLByte *rawBuffer,XMLSize_t rawByteCount)

{
  XMLByte XVar1;
  int iVar2;
  
  if (rawByteCount < 6) {
    if (rawByteCount < 2) {
      return UTF_8;
    }
    if (rawByteCount < 4) {
      if (*rawBuffer == 0xff) {
        if (rawBuffer[1] == 0xfe) {
          return UTF_16L;
        }
        return UTF_8;
      }
      if (*rawBuffer != 0xfe) {
        return UTF_8;
      }
      if (rawBuffer[1] == 0xff) {
        return UTF_16B;
      }
      return UTF_8;
    }
  }
  else {
    iVar2 = bcmp(rawBuffer,"<?xml ",6);
    if (iVar2 == 0) {
      return UTF_8;
    }
  }
  XVar1 = *rawBuffer;
  if (XVar1 == 0xff) {
    if (rawBuffer[1] == 0xfe) {
      if (rawBuffer[2] != '\0') {
        return UTF_16L;
      }
      if (rawBuffer[3] != '\0') {
        return UTF_16L;
      }
      return UCS_4L;
    }
  }
  else {
    if (XVar1 == '<') {
LAB_0029cc11:
      if (rawByteCount < 0x18) {
        if (rawByteCount < 0xc) goto LAB_0029cc9b;
      }
      else {
        iVar2 = bcmp(rawBuffer,fgUCS4BPre,0x18);
        if (iVar2 == 0) {
          return UCS_4B;
        }
        iVar2 = bcmp(rawBuffer,fgUCS4LPre,0x18);
        if (iVar2 == 0) {
          return UCS_4L;
        }
      }
      iVar2 = bcmp(rawBuffer,fgUTF16BPre,0xc);
      if (iVar2 == 0) {
        return UTF_16B;
      }
      iVar2 = bcmp(rawBuffer,fgUTF16LPre,0xc);
      if (iVar2 == 0) {
        return UTF_16L;
      }
      goto LAB_0029cca1;
    }
    if (XVar1 == 0xfe) {
      if (rawBuffer[1] == 0xff) {
        return UTF_16B;
      }
    }
    else if (XVar1 == '\0') {
      if (((rawBuffer[1] == '\0') && (rawBuffer[2] == 0xfe)) && (rawBuffer[3] == 0xff)) {
        return UCS_4B;
      }
      goto LAB_0029cc11;
    }
  }
LAB_0029cc9b:
  if (rawByteCount < 7) {
    return UTF_8;
  }
LAB_0029cca1:
  iVar2 = bcmp(rawBuffer,&fgEBCDICPre,6);
  if (iVar2 != 0) {
    return UTF_8;
  }
  return EBCDIC;
}

Assistant:

XMLRecognizer::Encodings
XMLRecognizer::basicEncodingProbe(  const   XMLByte* const  rawBuffer
                                    , const XMLSize_t       rawByteCount)
{
    //
    //  As an optimization to check the 90% case, check first for the ASCII
    //  sequence '<?xml', which means its either US-ASCII, UTF-8, or some
    //  other encoding that we don't do manually but which happens to share
    //  the US-ASCII code points for these characters. So just return UTF-8
    //  to get us through the first line.
    //
    if (rawByteCount >= fgASCIIPreLen)
    {
        if (!memcmp(rawBuffer, fgASCIIPre, fgASCIIPreLen))
            return UTF_8;
    }

    //
    //  If the count of raw bytes is less than 2, it cannot be anything
    //  we understand, so return UTF-8 as a fallback.
    //
    if (rawByteCount < 2)
        return UTF_8;
         
    //  
    //  We have two to four bytes, so lets check for a UTF-16 BOM. That
    //  is quick to check and enough to identify two major encodings.   
    // 

    if (rawByteCount < 4)
    {
        if ((rawBuffer[0] == 0xFE) && (rawBuffer[1] == 0xFF))
            return UTF_16B;
        else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE))
            return UTF_16L;
        else 
            return UTF_8;
    }

    /***
     *    F.1 Detection Without External Encoding Information
     *
     *    Because each XML entity not accompanied by external encoding information and 
     *    not in UTF-8 or UTF-16 encoding must begin with an XML encoding declaration, 
     *    in which the first characters must be '<?xml', any conforming processor can detect, 
     *    after two to four octets of input, which of the following cases apply. 
     *
     *    In reading this list, it may help to know that in UCS-4, '<' is "#x0000003C" and 
     *    '?' is "#x0000003F", and the Byte Order Mark required of UTF-16 data streams is 
     *    "#xFEFF". The notation ## is used to denote any byte value except that two consecutive 
     *    ##s cannot be both 00.
     *
     *    With a Byte Order Mark:
     *
     *    00 00 FE FF           UCS-4,    big-endian machine    (1234 order) 
     *    FF FE 00 00           UCS-4,    little-endian machine (4321 order) 
     *    00 00 FF FE           UCS-4,    unusual octet order   (2143) 
     *    FE FF 00 00           UCS-4,    unusual octet order   (3412) 
     *    FE FF ## ##           UTF-16,   big-endian 
     *    FF FE ## ##           UTF-16,   little-endian 
     *    EF BB BF              UTF-8 
     *
     ***/

    //
    //  We have at least four bytes, so we can check all BOM
    //  for UCS-4BE, UCS-4LE, UTF-16BE and UTF-16LE as well.
    //
    if ((rawBuffer[0] == 0x00) && (rawBuffer[1] == 0x00) && (rawBuffer[2] == 0xFE) && (rawBuffer[3] == 0xFF))
        return UCS_4B;
    else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE) && (rawBuffer[2] == 0x00) && (rawBuffer[3] == 0x00))
        return UCS_4L;
    else if ((rawBuffer[0] == 0xFE) && (rawBuffer[1] == 0xFF))
        return UTF_16B;
    else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE))
        return UTF_16L;

    //
    //  We have at least 4 bytes. So lets check the 4 byte sequences that
    //  indicate other UTF-16 and UCS encodings.
    //
    if ((rawBuffer[0] == 0x00) || (rawBuffer[0] == 0x3C))
    {
        if (rawByteCount >= fgUCS4PreLen && !memcmp(rawBuffer, fgUCS4BPre, fgUCS4PreLen))
            return UCS_4B;
        else if (rawByteCount >= fgUCS4PreLen && !memcmp(rawBuffer, fgUCS4LPre, fgUCS4PreLen))
            return UCS_4L;
        else if (rawByteCount >= fgUTF16PreLen && !memcmp(rawBuffer, fgUTF16BPre, fgUTF16PreLen))
            return UTF_16B;
        else if (rawByteCount >= fgUTF16PreLen && !memcmp(rawBuffer, fgUTF16LPre, fgUTF16PreLen))
            return UTF_16L;
    }

    //
    //  See if we have enough bytes to possibly match the EBCDIC prefix.
    //  If so, try it.
    //
    if (rawByteCount > fgEBCDICPreLen)
    {
        if (!memcmp(rawBuffer, fgEBCDICPre, fgEBCDICPreLen))
            return EBCDIC;
    }

    //
    //  Does not seem to be anything we know, so go with UTF-8 to get at
    //  least through the first line and see what it really is.
    //
    return UTF_8;
}